

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_info.hpp
# Opt level: O2

ArrowStringInfo * __thiscall
duckdb::ArrowTypeInfo::Cast<duckdb::ArrowStringInfo>(ArrowTypeInfo *this)

{
  InternalException *this_00;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  
  if (this->type == STRING) {
    return (ArrowStringInfo *)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,
             "Failed to cast ArrowTypeInfo, type mismatch (expected: %s, got: %s)",&local_79);
  EnumUtil::ToString<duckdb::ArrowTypeInfoType>(&local_58,STRING);
  EnumUtil::ToString<duckdb::ArrowTypeInfoType>(&local_78,this->type);
  InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
            (this_00,&local_38,&local_58,&local_78);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET &Cast() {
		D_ASSERT(dynamic_cast<TARGET *>(this));
		if (type != TARGET::TYPE) {
			throw InternalException("Failed to cast ArrowTypeInfo, type mismatch (expected: %s, got: %s)",
			                        EnumUtil::ToString(TARGET::TYPE), EnumUtil::ToString(type));
		}
		return reinterpret_cast<TARGET &>(*this);
	}